

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::EmbeddingLayerParams::_InternalParse
          (EmbeddingLayerParams *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  bool bVar2;
  WeightParams *msg;
  uint uVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *p;
  Arena *pAVar5;
  char cVar6;
  uint uVar7;
  pair<const_char_*,_unsigned_int> pVar8;
  pair<const_char_*,_unsigned_long> pVar9;
  byte *local_30;
  
  local_30 = (byte *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
  if (!bVar2) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *local_30;
      uVar7 = (uint)bVar1;
      p = local_30 + 1;
      if ((char)bVar1 < '\0') {
        uVar7 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if ((char)*p < '\0') {
          pVar8 = google::protobuf::internal::ReadTagFallback((char *)local_30,uVar7);
          p = (byte *)pVar8.first;
          uVar7 = pVar8.second;
        }
        else {
          p = local_30 + 2;
        }
      }
      uVar3 = uVar7 >> 3;
      cVar6 = (char)uVar7;
      local_30 = p;
      if (uVar3 < 10) {
        if (uVar3 == 1) {
          if (cVar6 == '\b') {
            uVar4 = (ulong)(char)*p;
            local_30 = p + 1;
            if ((long)uVar4 < 0) {
              uVar7 = ((uint)*local_30 * 0x80 + (uint)*p) - 0x80;
              if ((char)*local_30 < '\0') {
                local_30 = p;
                pVar9 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar7);
                local_30 = (byte *)pVar9.first;
                this->inputdim_ = pVar9.second;
                goto LAB_0026a14b;
              }
              uVar4 = (ulong)uVar7;
              local_30 = p + 2;
            }
            this->inputdim_ = uVar4;
            goto LAB_0026a154;
          }
        }
        else if ((uVar3 == 2) && (cVar6 == '\x10')) {
          uVar4 = (ulong)(char)*p;
          local_30 = p + 1;
          if ((long)uVar4 < 0) {
            uVar7 = ((uint)*local_30 * 0x80 + (uint)*p) - 0x80;
            if ((char)*local_30 < '\0') {
              local_30 = p;
              pVar9 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar7);
              local_30 = (byte *)pVar9.first;
              this->outputchannels_ = pVar9.second;
              goto LAB_0026a14b;
            }
            uVar4 = (ulong)uVar7;
            local_30 = p + 2;
          }
          this->outputchannels_ = uVar4;
          goto LAB_0026a154;
        }
        goto LAB_0026a10f;
      }
      if (uVar3 == 10) {
        if (cVar6 != 'P') goto LAB_0026a10f;
        uVar4 = (ulong)(char)*p;
        local_30 = p + 1;
        if ((long)uVar4 < 0) {
          uVar7 = ((uint)*local_30 * 0x80 + (uint)*p) - 0x80;
          if ((char)*local_30 < '\0') {
            local_30 = p;
            pVar9 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar7);
            local_30 = (byte *)pVar9.first;
            this->hasbias_ = pVar9.second != 0;
            goto LAB_0026a14b;
          }
          uVar4 = (ulong)uVar7;
          local_30 = p + 2;
        }
        this->hasbias_ = uVar4 != 0;
      }
      else {
        if (uVar3 == 0x14) {
          if (cVar6 == -0x5e) {
            msg = this->weights_;
            if (msg == (WeightParams *)0x0) {
              pAVar5 = (Arena *)(this_00->ptr_ & 0xfffffffffffffffc);
              if ((this_00->ptr_ & 1U) != 0) {
                pAVar5 = *(Arena **)pAVar5;
              }
              msg = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                              (pAVar5);
              this->weights_ = msg;
            }
            goto LAB_0026a0c3;
          }
LAB_0026a10f:
          if ((uVar7 == 0) || ((uVar7 & 7) == 4)) {
            if (p == (byte *)0x0) {
              return (char *)0x0;
            }
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar7 - 1;
            return (char *)p;
          }
          if ((this_00->ptr_ & 1U) == 0) {
            unknown = google::protobuf::internal::InternalMetadata::
                      mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
          }
          else {
            unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((this_00->ptr_ & 0xfffffffffffffffcU) + 8);
          }
          local_30 = (byte *)google::protobuf::internal::UnknownFieldParse
                                       (uVar7,unknown,(char *)local_30,ctx);
        }
        else {
          if ((uVar3 != 0x15) || (cVar6 != -0x56)) goto LAB_0026a10f;
          msg = this->bias_;
          if (msg == (WeightParams *)0x0) {
            pAVar5 = (Arena *)(this_00->ptr_ & 0xfffffffffffffffc);
            if ((this_00->ptr_ & 1U) != 0) {
              pAVar5 = *(Arena **)pAVar5;
            }
            msg = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                            (pAVar5);
            this->bias_ = msg;
          }
LAB_0026a0c3:
          local_30 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                       (ctx,&msg->super_MessageLite,(char *)local_30);
        }
LAB_0026a14b:
        if (local_30 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
LAB_0026a154:
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
    } while (!bVar2);
  }
  return (char *)local_30;
}

Assistant:

const char* EmbeddingLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // uint64 inputDim = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          inputdim_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // uint64 outputChannels = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          outputchannels_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool hasBias = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 80)) {
          hasbias_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.WeightParams weights = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          ptr = ctx->ParseMessage(_internal_mutable_weights(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.WeightParams bias = 21;
      case 21:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 170)) {
          ptr = ctx->ParseMessage(_internal_mutable_bias(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}